

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeFeature::IfcEdgeFeature(IfcEdgeFeature *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcEdgeFeature";
  IfcFeatureElementSubtraction::IfcFeatureElementSubtraction
            (&this->super_IfcFeatureElementSubtraction,&PTR_construction_vtable_24__008313a0);
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).field_0x160 = 0;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x831248;
  *(undefined8 *)&this->field_0x178 = 0x831388;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x831270;
  (this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x831298;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x8312c0;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x8312e8;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x138
       = 0x831310;
  *(undefined8 *)
   &(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.super_IfcElement.field_0x148
       = 0x831338;
  *(undefined8 *)&(this->super_IfcFeatureElementSubtraction).super_IfcFeatureElement.field_0x158 =
       0x831360;
  this->field_0x170 = 0;
  return;
}

Assistant:

IfcEdgeFeature() : Object("IfcEdgeFeature") {}